

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

Sample * __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::renderSample
          (Sample *__return_storage_ptr__,RenderCountCase *this,RenderData *occluder,
          RenderData *occluded,int callcount)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  deUint64 dVar4;
  deUint8 buffer [4];
  undefined1 local_3c [4];
  deUint64 local_38;
  long lVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x188))(0x4500);
  (**(code **)(lVar2 + 0x5e0))(0xb71);
  (**(code **)(lVar2 + 0x1220))(0,0,1,1,0x1908,0x1401,local_3c);
  local_38 = deGetMicroseconds();
  (**(code **)(lVar2 + 0x188))(0x4500);
  (**(code **)(lVar2 + 0x5e0))(0xb71);
  iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var_00,iVar1);
  (**(code **)(lVar3 + 0x1680))((occluder->m_program).m_program.m_program);
  (**(code **)(lVar3 + 0xd8))((occluder->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar3 + 0x538))(4,0,occluder->m_numVertices);
  (**(code **)(lVar3 + 0xd8))(0);
  iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var_01,iVar1);
  (**(code **)(lVar3 + 0x1680))((occluded->m_program).m_program.m_program);
  (**(code **)(lVar3 + 0xd8))((occluded->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar3 + 0x548))(4,0,occluded->m_numVertices,callcount);
  (**(code **)(lVar3 + 0xd8))(0);
  (**(code **)(lVar2 + 0x1220))(0,0,1,1,0x1908,0x1401,local_3c);
  dVar4 = deGetMicroseconds();
  __return_storage_ptr__->testTime = dVar4 - local_38;
  __return_storage_ptr__->nullTime = 0;
  __return_storage_ptr__->baseTime = 0;
  __return_storage_ptr__->workload = callcount;
  return __return_storage_ptr__;
}

Assistant:

Sample RenderCountCase::renderSample (const RenderData& occluder, const RenderData& occluded, int callcount) const
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	Sample					sample;
	deUint64				now		= 0;
	deUint64				prev	= 0;
	deUint8					buffer[4];

	// Stabilize
	{
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
		gl.enable(GL_DEPTH_TEST);
		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);
	}

	prev = deGetMicroseconds();

	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	render(occluder);
	render(occluded, callcount);

	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

	now = deGetMicroseconds();

	sample.testTime = now - prev;
	sample.baseTime = 0;
	sample.nullTime = 0;
	sample.workload = callcount;

	return sample;
}